

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

reverse_iterator * __thiscall
llvm::sys::path::rend(reverse_iterator *__return_storage_ptr__,path *this,StringRef Path)

{
  unsigned_long uVar1;
  unsigned_long *puVar2;
  path *ppVar3;
  reverse_iterator *I;
  path *ppStack_60;
  StringRef Path_local;
  unsigned_long local_48;
  unsigned_long local_40;
  path **local_38;
  
  Path_local.Data = Path.Data;
  ppStack_60 = this;
  reverse_iterator::reverse_iterator(__return_storage_ptr__);
  (__return_storage_ptr__->Path).Data = (char *)ppStack_60;
  (__return_storage_ptr__->Path).Length = (size_t)Path_local.Data;
  local_38 = &ppStack_60;
  local_40 = 0;
  local_48 = 0;
  puVar2 = std::min<unsigned_long>(&local_40,(unsigned_long *)&Path_local);
  local_40 = *puVar2;
  ppVar3 = ppStack_60 + local_40;
  Path_local.Length = (long)Path_local.Data - local_40;
  puVar2 = std::min<unsigned_long>(&local_48,&Path_local.Length);
  uVar1 = *puVar2;
  (__return_storage_ptr__->Component).Data = (char *)ppVar3;
  (__return_storage_ptr__->Component).Length = uVar1;
  __return_storage_ptr__->Position = 0;
  return __return_storage_ptr__;
}

Assistant:

reverse_iterator rend(StringRef Path) {
  reverse_iterator I;
  I.Path = Path;
  I.Component = Path.substr(0, 0);
  I.Position = 0;
  return I;
}